

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O0

void x25519_ge_p1p1_to_p3(ge_p3 *r,ge_p1p1 *p)

{
  ge_p1p1 *p_local;
  ge_p3 *r_local;
  
  fe_mul_tll(&r->X,&p->X,&p->T);
  fe_mul_tll(&r->Y,&p->Y,&p->Z);
  fe_mul_tll(&r->Z,&p->Z,&p->T);
  fe_mul_tll(&r->T,&p->X,&p->Y);
  return;
}

Assistant:

void x25519_ge_p1p1_to_p3(ge_p3 *r, const ge_p1p1 *p) {
  fe_mul_tll(&r->X, &p->X, &p->T);
  fe_mul_tll(&r->Y, &p->Y, &p->Z);
  fe_mul_tll(&r->Z, &p->Z, &p->T);
  fe_mul_tll(&r->T, &p->X, &p->Y);
}